

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

bool __thiscall ON_Xform::IsLinear(ON_Xform *this)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  bVar2 = IsAffine(this);
  bVar3 = false;
  bVar4 = false;
  if ((((bVar2) && (dVar1 = this->m_xform[0][3], bVar4 = bVar3, dVar1 == 0.0)) && (!NAN(dVar1))) &&
     ((dVar1 = this->m_xform[1][3], dVar1 == 0.0 && (!NAN(dVar1))))) {
    bVar4 = (bool)(-(this->m_xform[2][3] == 0.0) & 1);
  }
  return bVar4;
}

Assistant:

bool ON_Xform::IsLinear() const
{
	return (IsAffine() 
		&& 0.0 == m_xform[0][3]
		&& 0.0 == m_xform[1][3]
		&& 0.0 == m_xform[2][3]);
}